

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void prepare_pragma_string(char *repr,VARR_char *to)

{
  char cVar1;
  MIR_context_t pMVar2;
  parse_ctx *ppVar3;
  token_t ptVar4;
  undefined8 uVar5;
  node_code_t *pnVar6;
  short sVar7;
  int iVar8;
  uint uVar9;
  size_t sVar10;
  c2m_ctx_t __ptr;
  long extraout_RAX;
  node_t_conflict pnVar11;
  node_t_conflict pnVar12;
  node_t_conflict pnVar13;
  node_t_conflict pnVar14;
  node_t_conflict op;
  node_t pnVar15;
  char *pcVar16;
  node_t_conflict pnVar17;
  ulong uVar18;
  size_t sVar19;
  undefined8 unaff_RBP;
  VARR_char *pVVar20;
  c2m_ctx_t c2m_ctx;
  ulong unaff_R12;
  ulong unaff_R13;
  VARR_char *unaff_R15;
  pos_t pVar21;
  pos_t pVar22;
  node_t_conflict in_stack_ffffffffffffff38;
  uint uStack_b4;
  node_t_conflict pnStack_b0;
  uint uStack_a4;
  node_t_conflict pnStack_a0;
  node_t_conflict pnStack_98;
  char *pcStack_90;
  tpname_t tStack_88;
  VARR_char *pVStack_70;
  ulong uStack_68;
  ulong uStack_60;
  char *pcStack_58;
  VARR_char *pVStack_50;
  code *pcStack_48;
  code *pcStack_40;
  
  pcStack_40 = (code *)0x194351;
  pVVar20 = to;
  c2m_ctx = (c2m_ctx_t)repr;
  sVar10 = strlen(repr);
  if ((to != (VARR_char *)0x0) && (to->varr != (char *)0x0)) {
    to->els_num = 0;
    iVar8 = (int)sVar10;
    if ((iVar8 != 0) && (cVar1 = *repr, cVar1 != '\"' || iVar8 != 1)) {
      pVVar20 = (VARR_char *)(long)(iVar8 + -1);
      c2m_ctx = (c2m_ctx_t)(ulong)(repr[(long)pVVar20] == '\"');
      uVar9 = iVar8 - (uint)(repr[(long)pVVar20] == '\"');
      if ((int)(uint)(cVar1 == '\"') < (int)uVar9) {
        unaff_R12 = (ulong)uVar9;
        unaff_R13 = (ulong)(cVar1 == '\"');
        do {
          cVar1 = repr[unaff_R13];
          unaff_RBP = CONCAT71((int7)((ulong)unaff_RBP >> 8),cVar1);
          if (((cVar1 != '\\') || ((long)unaff_R12 <= (long)(unaff_R13 + 1))) ||
             ((repr[unaff_R13 + 1] != '\"' && (repr[unaff_R13 + 1] != '\\')))) {
            __ptr = (c2m_ctx_t)to->varr;
            if (__ptr == (c2m_ctx_t)0x0) {
              pcStack_40 = (code *)0x194445;
              prepare_pragma_string_cold_1();
              goto LAB_00194445;
            }
            sVar19 = to->els_num;
            uVar18 = sVar19 + 1;
            if (to->size < uVar18) {
              unaff_R15 = (VARR_char *)((uVar18 >> 1) + uVar18);
              pcStack_40 = (code *)0x194406;
              pVVar20 = unaff_R15;
              c2m_ctx = __ptr;
              __ptr = (c2m_ctx_t)realloc(__ptr,(size_t)unaff_R15);
              to->varr = (char *)__ptr;
              to->size = (size_t)unaff_R15;
              sVar19 = to->els_num;
              uVar18 = sVar19 + 1;
            }
            to->els_num = uVar18;
            *(char *)((long)__ptr->env[0].__jmpbuf + (sVar19 - 0x10)) = cVar1;
          }
          unaff_R13 = unaff_R13 + 1;
        } while (unaff_R13 != unaff_R12);
      }
    }
    reverse(to);
    return;
  }
LAB_00194445:
  pcStack_40 = read_token;
  prepare_pragma_string_cold_2();
  pcStack_40 = (code *)extraout_RAX;
  if (((c2m_ctx != (c2m_ctx_t)0x0) &&
      (pcStack_40 = (code *)c2m_ctx->env[0].__jmpbuf[0], pcStack_40 != (code *)0x0)) &&
     (pMVar2 = (MIR_context_t)pVVar20->size, pMVar2 < c2m_ctx->ctx)) {
    pVVar20->varr = *(char **)((long)pcStack_40 + (long)pMVar2 * 8);
    pVVar20->size = (size_t)((long)&pMVar2->gen_ctx + 1);
    return;
  }
  pcStack_48 = declaration;
  read_token_cold_1();
  ppVar3 = c2m_ctx->parse_ctx;
  pnStack_b0 = (node_t_conflict)0x0;
  ptVar4 = ppVar3->curr_token;
  pVStack_70 = to;
  uStack_68 = unaff_R12;
  uStack_60 = unaff_R13;
  pcStack_58 = repr;
  pVStack_50 = unaff_R15;
  pcStack_48 = (code *)unaff_RBP;
  if (*(short *)ptVar4 == 0x3b) {
    pcVar16 = (ptVar4->pos).fname;
    uVar5._0_4_ = (ptVar4->pos).lno;
    uVar5._4_4_ = (ptVar4->pos).ln_pos;
    read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
    new_node(c2m_ctx,N_LIST);
    if ((ppVar3->curr_scope == c2m_ctx->top_scope) && (c2m_ctx->options->pedantic_p != 0)) {
      warning(c2m_ctx,0x1c1b99,pcVar16,uVar5);
    }
  }
  else {
    uVar18 = (ulong)pVVar20 & 0xffffffff;
    uVar9 = (uint)pVVar20;
    if (*(short *)ptVar4 == 0x117) {
      st_assert(c2m_ctx,uVar9);
      return;
    }
    try_attr_spec(c2m_ctx,ptVar4->pos,(node_t_conflict *)0x0);
    pnVar11 = declaration_specs(c2m_ctx,uVar9,
                                (node_t_conflict)(ulong)(ppVar3->curr_scope == c2m_ctx->top_scope));
    if (pnVar11 != &err_struct) {
      get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,(node_t_conflict)(ulong)pnVar11->uid);
      pnStack_a0 = new_node(c2m_ctx,N_LIST);
      if (*(short *)ppVar3->curr_token == 0x3b) {
        pnVar12 = new_node(c2m_ctx,N_IGNORE);
        pnVar13 = new_node(c2m_ctx,N_IGNORE);
        pnVar14 = new_node(c2m_ctx,N_IGNORE);
        op = new_node(c2m_ctx,N_IGNORE);
        pnVar17 = pnStack_a0;
        pnVar11 = new_node4(c2m_ctx,N_SPEC_DECL,pnVar11,pnVar12,pnVar13,pnVar14);
        op_append(c2m_ctx,pnVar11,op);
        op_append(c2m_ctx,pnVar17,pnVar11);
        sVar7 = *(short *)c2m_ctx->parse_ctx->curr_token;
LAB_00194631:
        if (sVar7 == 0x3b) {
          read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
        }
        else if (ppVar3->record_level == 0) {
          pcVar16 = get_token_name(c2m_ctx,0x3b);
          syntax_error(c2m_ctx,pcVar16);
        }
      }
      else {
        pnVar15 = (pnVar11->u).ops.head;
        if (pnVar15 == (node_t)0x0) {
          uStack_b4 = 0;
        }
        else {
          do {
            pnVar6 = &pnVar15->code;
            if (*pnVar6 == N_TYPEDEF) break;
            pnVar15 = (pnVar15->op_link).next;
          } while (pnVar15 != (node_t)0x0);
          uStack_b4 = (uint)(*pnVar6 == N_TYPEDEF);
        }
        pnVar17 = declarator(c2m_ctx,uVar9);
        uStack_a4 = uVar9;
        pnStack_98 = pnVar11;
        if (pnVar17 != &err_struct) {
          do {
            pVar21 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                                  (node_t_conflict)(ulong)pnVar17->uid);
            if (pnVar17->code != N_DECL) {
              __assert_fail("decl->code == N_DECL",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                            ,0x1135,"node_t declaration(c2m_ctx_t, int)");
            }
            tpname_add(&tStack_88,(c2m_ctx_t)c2m_ctx->parse_ctx,(pnVar17->u).ops.head,
                       ppVar3->curr_scope,uStack_b4);
            pnVar11 = try_attr_spec(c2m_ctx,pVar21,&pnStack_b0);
            if (pnVar11 == &err_struct) {
              pnVar11 = new_node(c2m_ctx,N_IGNORE);
            }
            if (pnStack_b0 == (node_t_conflict)0x0) {
              pnStack_b0 = new_node(c2m_ctx,N_IGNORE);
            }
            if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x3d) {
              read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
              pnVar12 = initializer(c2m_ctx,(int)uVar18);
              if (pnVar12 == &err_struct) {
                return;
              }
            }
            else {
              pnVar12 = new_node(c2m_ctx,N_IGNORE);
            }
            pVar22 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                                  (node_t_conflict)(ulong)pnVar17->uid);
            pVar21.fname = pVar22._8_8_;
            pcStack_90 = pVar22.fname;
            pnVar14 = new_node(c2m_ctx,N_SHARE);
            op_append(c2m_ctx,pnVar14,pnStack_98);
            pnVar13 = pnStack_a0;
            pVar21._8_8_ = pnVar14;
            pnVar11 = new_pos_node5(c2m_ctx,(node_code_t)pcStack_90,pVar21,pnVar17,pnVar11,
                                    pnStack_b0,pnVar12,in_stack_ffffffffffffff38);
            op_append(c2m_ctx,pnVar13,pnVar11);
            sVar7 = *(short *)c2m_ctx->parse_ctx->curr_token;
            if (sVar7 != 0x2c) goto LAB_00194631;
            read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
            uVar18 = (ulong)uStack_a4;
            pnVar17 = declarator(c2m_ctx,uStack_a4);
          } while (pnVar17 != &err_struct);
        }
      }
    }
  }
  return;
}

Assistant:

static void prepare_pragma_string (const char *repr, VARR (char) * to) {
  destringify (repr, to);
  reverse (to);
}